

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

int __thiscall cmCursesMainForm::Configure(cmCursesMainForm *this,int noconfigure)

{
  cmake *this_00;
  bool bVar1;
  char *pcVar2;
  cmCursesLongMessageForm *this_01;
  uint local_d0;
  uint local_cc;
  int local_ac;
  uint local_a0;
  uint local_9c;
  cmCursesLongMessageForm *msgs;
  int yy;
  int xx;
  int retVal;
  allocator local_49;
  string local_48;
  uint local_24;
  uint local_20;
  int yi;
  int xi;
  int noconfigure_local;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_9c = 0xffffffff;
  }
  else {
    local_9c = (int)*(short *)(_stdscr + 4) + 1;
  }
  local_24 = local_9c;
  if (_stdscr == 0) {
    local_a0 = 0xffffffff;
  }
  else {
    local_a0 = (int)*(short *)(_stdscr + 6) + 1;
  }
  local_20 = local_a0;
  yi = noconfigure;
  _xi = this;
  curses_move(1,1);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Configuring, please wait...");
  PrintKeys(this,1);
  if (_stdscr == 0) {
    local_ac = -1;
  }
  else {
    local_ac = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,local_ac,1);
  refresh();
  cmake::SetProgressCallback(this->CMakeInstance,UpdateProgress,this);
  FillCacheManagerFromUI(this);
  this_00 = this->CMakeInstance;
  pcVar2 = cmake::GetHomeOutputDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar2,&local_49);
  cmake::SaveCache(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  LoadCache(this,(char *)0x0);
  memset(&xx,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&xx);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Errors,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&xx);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&xx);
  this->OkToGenerate = true;
  if (yi == 0) {
    yy = cmake::Configure(this->CMakeInstance);
  }
  else {
    yy = cmake::DoPreConfigureChecks(this->CMakeInstance);
    this->OkToGenerate = false;
    if (0 < yy) {
      yy = 0;
    }
  }
  cmake::SetProgressCallback(this->CMakeInstance,(ProgressCallbackType)0x0,(void *)0x0);
  keypad(_stdscr,1);
  if ((yy != 0) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->Errors), !bVar1)) {
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    if (_stdscr == 0) {
      local_cc = 0xffffffff;
      local_d0 = 0xffffffff;
    }
    else {
      local_cc = (int)*(short *)(_stdscr + 4) + 1;
      local_d0 = (int)*(short *)(_stdscr + 6) + 1;
    }
    this_01 = (cmCursesLongMessageForm *)operator_new(0x60);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    pcVar2 = "CMake produced the following output.";
    if (bVar1) {
      pcVar2 = "Errors occurred during the last pass.";
    }
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_01,&this->Errors,pcVar2);
    cmSystemTools::ResetErrorOccuredFlag();
    cmCursesForm::CurrentForm = (cmCursesForm *)this_01;
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[3])
              (this_01,1,1,(ulong)local_d0,(ulong)local_cc);
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[2])();
    if (yy == -2) {
      return -2;
    }
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_d0,(ulong)local_cc);
  }
  InitializeUI(this);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_20,(ulong)local_24);
  return 0;
}

Assistant:

int cmCursesMainForm::Configure(int noconfigure)
{
  int xi,yi;
  getmaxyx(stdscr, yi, xi);

  curses_move(1,1);
  this->UpdateStatusBar("Configuring, please wait...");
  this->PrintKeys(1);
  touchwin(stdscr);
  refresh();
  this->CMakeInstance->SetProgressCallback(cmCursesMainForm::UpdateProgress, this);

  // always save the current gui values to disk
  this->FillCacheManagerFromUI();
  this->CMakeInstance->SaveCache(
    this->CMakeInstance->GetHomeOutputDirectory());
  this->LoadCache(0);

  // Get rid of previous errors
  this->Errors = std::vector<std::string>();

  // run the generate process
  this->OkToGenerate = true;
  int retVal;
  if ( noconfigure )
    {
    retVal = this->CMakeInstance->DoPreConfigureChecks();
    this->OkToGenerate = false;
    if ( retVal > 0 )
      {
      retVal = 0;
      }
    }
  else
    {
    retVal = this->CMakeInstance->Configure();
    }
  this->CMakeInstance->SetProgressCallback(0, 0);

  keypad(stdscr,TRUE); /* Use key symbols as
                          KEY_DOWN*/

  if( retVal != 0 || !this->Errors.empty())
    {
    // see if there was an error
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      this->OkToGenerate = false;
      }
    int xx,yy;
    getmaxyx(stdscr, yy, xx);
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Errors,
      cmSystemTools::GetErrorOccuredFlag()
      ? "Errors occurred during the last pass." :
      "CMake produced the following output.");
    // reset error condition
    cmSystemTools::ResetErrorOccuredFlag();
    CurrentForm = msgs;
    msgs->Render(1,1,xx,yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if ( retVal == -2 )
      {
      return retVal;
      }
    CurrentForm = this;
    this->Render(1,1,xx,yy);
    }

  this->InitializeUI();
  this->Render(1, 1, xi, yi);

  return 0;
}